

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void KYBER_generate_key_external_entropy
               (uint8_t *out_encoded_public_key,KYBER_private_key *out_private_key,uint8_t *entropy)

{
  int iVar1;
  undefined1 local_6b0 [8];
  CBB cbb;
  vector error;
  uint8_t counter;
  uint8_t *sigma;
  uint8_t *rho;
  uint8_t hashed [64];
  private_key *priv;
  uint8_t *entropy_local;
  KYBER_private_key *out_private_key_local;
  uint8_t *out_encoded_public_key_local;
  
  hashed._56_8_ = anon_unknown.dwarf_331ec3::private_key_from_external(out_private_key);
  hash_g((uint8_t *)&rho,entropy,0x20);
  register0x00000000 = hashed + 0x18;
  OPENSSL_memcpy((void *)(hashed._56_8_ + 0x600),&rho,0x20);
  matrix_expand((matrix *)(hashed._56_8_ + 0x640),(uint8_t *)&rho);
  error.v[2].c[0xfc]._1_1_ = 0;
  vector_generate_secret_eta_2
            ((vector *)(hashed._56_8_ + 0x1840),(uint8_t *)((long)error.v[2].c + 0x1f9),
             stack0xffffffffffffff88);
  vector_ntt((vector *)(hashed._56_8_ + 0x1840));
  vector_generate_secret_eta_2
            ((vector *)((long)&cbb.u + 0x1e),(uint8_t *)((long)error.v[2].c + 0x1f9),
             stack0xffffffffffffff88);
  vector_ntt((vector *)((long)&cbb.u + 0x1e));
  matrix_mult_transpose
            ((vector *)hashed._56_8_,(matrix *)(hashed._56_8_ + 0x640),
             (vector *)(hashed._56_8_ + 0x1840));
  vector_add((vector *)hashed._56_8_,(vector *)((long)&cbb.u + 0x1e));
  CBB_init_fixed((CBB *)local_6b0,out_encoded_public_key,0x4a0);
  iVar1 = kyber_marshal_public_key((CBB *)local_6b0,(public_key *)hashed._56_8_);
  if (iVar1 == 0) {
    abort();
  }
  hash_h((uint8_t *)(hashed._56_8_ + 0x620),out_encoded_public_key,0x4a0);
  OPENSSL_memcpy((void *)(hashed._56_8_ + 0x1e40),entropy + 0x20,0x20);
  return;
}

Assistant:

void KYBER_generate_key_external_entropy(
    uint8_t out_encoded_public_key[KYBER_PUBLIC_KEY_BYTES],
    struct KYBER_private_key *out_private_key,
    const uint8_t entropy[KYBER_GENERATE_KEY_ENTROPY]) {
  struct private_key *priv = private_key_from_external(out_private_key);
  uint8_t hashed[64];
  hash_g(hashed, entropy, 32);
  const uint8_t *const rho = hashed;
  const uint8_t *const sigma = hashed + 32;
  // rho is public.
  CONSTTIME_DECLASSIFY(rho, 32);
  OPENSSL_memcpy(priv->pub.rho, hashed, sizeof(priv->pub.rho));
  matrix_expand(&priv->pub.m, rho);
  uint8_t counter = 0;
  vector_generate_secret_eta_2(&priv->s, &counter, sigma);
  vector_ntt(&priv->s);
  vector error;
  vector_generate_secret_eta_2(&error, &counter, sigma);
  vector_ntt(&error);
  matrix_mult_transpose(&priv->pub.t, &priv->pub.m, &priv->s);
  vector_add(&priv->pub.t, &error);
  // t is part of the public key and thus is public.
  CONSTTIME_DECLASSIFY(&priv->pub.t, sizeof(priv->pub.t));

  CBB cbb;
  CBB_init_fixed(&cbb, out_encoded_public_key, KYBER_PUBLIC_KEY_BYTES);
  if (!kyber_marshal_public_key(&cbb, &priv->pub)) {
    abort();
  }

  hash_h(priv->pub.public_key_hash, out_encoded_public_key,
         KYBER_PUBLIC_KEY_BYTES);
  OPENSSL_memcpy(priv->fo_failure_secret, entropy + 32, 32);
}